

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::tick(optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this,
              float p_delta_time)

{
  bool bVar1;
  element_type *peVar2;
  float *pfVar3;
  optional<PSEngine::TurnHistory> local_100;
  undefined1 local_d1;
  float local_d0;
  allocator<char> local_c9;
  float realtime_interval;
  undefined1 local_a8 [8];
  Operation op;
  allocator<char> local_61;
  string local_60 [32];
  string local_40 [36];
  float local_1c;
  PSEngine *pPStack_18;
  float p_delta_time_local;
  PSEngine *this_local;
  optional<PSEngine::TurnHistory> *result;
  
  local_1c = p_delta_time;
  pPStack_18 = this;
  this_local = (PSEngine *)__return_storage_ptr__;
  bVar1 = std::optional<float>::has_value(&(this->m_compiled_game).prelude_info.realtime_interval);
  if (bVar1) {
    if (((this->m_config).add_ticks_to_operation_history & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&realtime_interval,"",&local_c9);
      Operation::Operation((Operation *)local_a8,Undo,None,-1,(string *)&realtime_interval);
      std::__cxx11::string::~string((string *)&realtime_interval);
      std::allocator<char>::~allocator(&local_c9);
      op.input_type = (InputType)local_1c;
      std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::push_back
                (&this->m_operation_history,(value_type *)local_a8);
      Operation::~Operation((Operation *)local_a8);
    }
    pfVar3 = std::optional<float>::value(&(this->m_compiled_game).prelude_info.realtime_interval);
    local_d0 = *pfVar3;
    this->m_current_tick_time_elapsed = local_1c + this->m_current_tick_time_elapsed;
    local_d1 = 0;
    std::optional<PSEngine::TurnHistory>::optional(__return_storage_ptr__);
    while (local_d0 <= this->m_current_tick_time_elapsed) {
      this->m_current_tick_time_elapsed = this->m_current_tick_time_elapsed - local_d0;
      next_turn(&local_100,this);
      std::optional<PSEngine::TurnHistory>::operator=(__return_storage_ptr__,&local_100);
      std::optional<PSEngine::TurnHistory>::~optional(&local_100);
    }
  }
  else {
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar2 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&this->m_logger);
      std::__cxx11::string::string(local_40,(string *)&m_engine_log_cat_abi_cxx11_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,
                 "Trying to tick the engine but the loaded puzzlescript doesn\'t have realtime setup."
                 ,&local_61);
      (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_40,local_60);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
      std::__cxx11::string::~string(local_40);
      if (((this->m_config).log_operation_history_after_error & 1U) != 0) {
        print_operation_history(this);
      }
    }
    std::optional<PSEngine::TurnHistory>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::tick(float p_delta_time)
{
    if(!m_compiled_game.prelude_info.realtime_interval.has_value())
    {
        PS_LOG_ERROR("Trying to tick the engine but the loaded puzzlescript doesn't have realtime setup.");
        return nullopt;
    }

    if(m_config.add_ticks_to_operation_history)
    {
        Operation op = Operation(OperationType::Undo);
        op.delta_time = p_delta_time;
        m_operation_history.push_back(op);
    }


    float realtime_interval = m_compiled_game.prelude_info.realtime_interval.value();

    m_current_tick_time_elapsed += p_delta_time;

    optional<TurnHistory> result = nullopt;

    while(m_current_tick_time_elapsed >= realtime_interval)
    {
        m_current_tick_time_elapsed -= realtime_interval;
        result = next_turn();
    }

    return result; //todo ? only yhe last one will be return if several turns happened during the same tick
}